

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::DepthGradientShader
          (DepthGradientShader *this,DataType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  UniformSlot *pUVar3;
  allocator<char> local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  allocator<char> local_3a0;
  allocator<char> local_39f;
  allocator<char> local_39e;
  allocator<char> local_39d;
  FragmentOutput local_39c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  FragmentSource local_2f8;
  string local_2d8 [32];
  VertexSource local_2b8;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  VertexToFragmentVarying local_1f8;
  Uniform local_1f0;
  Uniform local_1c8;
  Uniform local_1a0;
  VertexAttribute local_178;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::__cxx11::string::string<std::allocator<char>>(local_218,"a_position",&local_39d);
  std::__cxx11::string::string((string *)&local_150,local_218);
  local_150.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  std::__cxx11::string::string<std::allocator<char>>(local_238,"a_coord",&local_39e);
  std::__cxx11::string::string((string *)&local_178,local_238);
  local_178.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_178);
  local_1f8.type = GENERICVECTYPE_FLOAT;
  local_1f8.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f8);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_39c.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_39c.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_39c.type = GENERICVECTYPE_INT32;
  }
  else {
    local_39c.type = GENERICVECTYPE_LAST;
  }
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_39c);
  std::__cxx11::string::string<std::allocator<char>>(local_258,"u_maxGradient",&local_39f);
  std::__cxx11::string::string((string *)&local_1a0,local_258);
  local_1a0.type = TYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>(local_278,"u_minGradient",&local_3a0);
  std::__cxx11::string::string((string *)&local_1c8,local_278);
  local_1c8.type = TYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>(local_298,"u_color",&local_3a1);
  std::__cxx11::string::string((string *)&local_1f0,local_298);
  local_1f0.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coord;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_3a2);
  std::__cxx11::string::string((string *)&local_2b8,local_2d8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,
             "#version 300 es\nin highp vec4 v_coord;\nuniform highp float u_minGradient;\nuniform highp float u_maxGradient;\nuniform highp vec4 u_color;\nlayout(location = 0) out highp "
             ,&local_3a3);
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_378,&local_398,pcVar2);
  std::operator+(&local_358,&local_378,
                 " o_color;\nvoid main (void)\n{\n\thighp float x = v_coord.x;\n\thighp float y = v_coord.y;\n\thighp float f0 = (x + y) * 0.5;\n\tgl_FragDepth = u_minGradient + (u_maxGradient-u_minGradient)*f0;\n\to_color = "
                );
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_338,&local_358,pcVar2);
  std::operator+(&local_318,&local_338,"(u_color);\n}\n");
  std::__cxx11::string::string((string *)&local_2f8,(string *)&local_318);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_218);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00c26610;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00c26648;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00c26660;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = outputType;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_minGradient");
  this->u_minGradient = pUVar3;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_maxGradient");
  this->u_maxGradient = pUVar3;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_color");
  this->u_color = pUVar3;
  return;
}

Assistant:

DepthGradientShader::DepthGradientShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_maxGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_minGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"in highp vec4 a_coord;\n"
							"out highp vec4 v_coord;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_coord = a_coord;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"in highp vec4 v_coord;\n"
								"uniform highp float u_minGradient;\n"
								"uniform highp float u_maxGradient;\n"
								"uniform highp vec4 u_color;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	highp float x = v_coord.x;\n"
								"	highp float y = v_coord.y;\n"
								"	highp float f0 = (x + y) * 0.5;\n"
								"	gl_FragDepth = u_minGradient + (u_maxGradient-u_minGradient)*f0;\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_color);\n"
								"}\n"))
	, m_outputType	(outputType)
	, u_minGradient	(getUniformByName("u_minGradient"))
	, u_maxGradient	(getUniformByName("u_maxGradient"))
	, u_color		(getUniformByName("u_color"))
{
}